

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_reduce_qtree_single
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,bsc_pid_t q)

{
  long lVar1;
  int iVar2;
  bsp_pid_t bVar3;
  uint n;
  int iVar4;
  void *dst_00;
  int iVar5;
  void *local_c8;
  bsc_pid_t local_ac;
  void *local_a0;
  int local_84;
  char *gather;
  void *accum;
  char *tmp_bytes;
  bsc_pid_t me;
  bsc_pid_t r;
  bsc_pid_t range;
  bsc_pid_t P;
  bsc_pid_t k;
  bsc_pid_t j;
  bsc_pid_t i;
  group_t *g;
  void *tmp_space_local;
  void *dst_local;
  void *src_local;
  bsc_group_t group_local;
  bsc_step_t local_10;
  bsc_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    iVar2 = bsp_nprocs();
    local_84 = bsp_pid();
  }
  else {
    iVar2 = *group;
    root = *(int *)(*(long *)((long)group + 8) + (long)root * 4);
    lVar1 = *(long *)((long)group + 8);
    bVar3 = bsp_pid();
    local_84 = *(int *)(lVar1 + (long)bVar3 * 4);
  }
  iVar5 = ((local_84 + iVar2) - root) % iVar2;
  dst_00 = (void *)((long)tmp_space + (long)size);
  local_a0 = tmp_space;
  if (iVar2 == 1) {
    local_a0 = dst;
  }
  (*reducer)(local_a0,zero,src,size * nmemb);
  root_local = depends;
  if (iVar2 != 1) {
    n = int_log(q,iVar2 - 1);
    me = int_pow(q,n);
    local_10 = depends;
    for (; 0 < me; me = me / q) {
      if (iVar5 < me) {
        range = 1;
        for (k = 1; k < q; k = k + 1) {
          iVar4 = k * me + iVar5;
          if (iVar4 < iVar2) {
            local_ac = (iVar4 + root) % iVar2;
            if (group != (bsc_group_t)0x0) {
              local_ac = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)local_ac * 4);
            }
            bsc_get(local_10,local_ac,tmp_space,0,(void *)((long)dst_00 + (long)(range * size)),size
                   );
            range = range + 1;
          }
        }
        bVar3 = bsp_pid();
        bsc_get(local_10,bVar3,tmp_space,0,dst_00,size);
        local_c8 = tmp_space;
        if (me == 1) {
          local_c8 = dst;
        }
        bsc_exec_reduce(local_10,reducer,local_c8,zero,dst_00,size * range);
      }
      local_10 = local_10 + 1;
    }
    root_local = local_10;
  }
  return root_local;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_reduce_qtree_single( bsc_step_t depends, 
        bsc_pid_t root, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size, bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, r = g?g->lid[root]:root;
    bsc_pid_t me = ((g?g->lid[ bsp_pid() ] : bsp_pid()) + P - r) %P;
    char * tmp_bytes = tmp_space;
    void * accum = tmp_bytes;
    char * gather = tmp_bytes + size;

    (*reducer)( P==1?dst:accum, zero, src, size * nmemb );
    if (P == 1) {
        return depends;
    }
    
    for (range = int_pow( q, int_log( q, P-1));
            range >= 1; range /= q ) {
        if ( me < range ) {
            k = 1;
            for ( i = 1 ; i < q; ++i) {
                j = i * range + me; 
                if (j < P) {
                    j = (j + r )% P;
                    bsc_get( depends, g?g->gid[j]:j, accum, 0, 
                            &gather[k*size], size );
                    k += 1;
                }
            }
            bsc_get( depends, bsp_pid(), accum, 0, &gather[0], size );
            bsc_exec_reduce( depends, reducer, 
                    range==1?dst:accum, zero, gather, size * k );
        }
        depends += 1;
    }
    return depends;

}